

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS ref_smooth_tet_nso(REF_GRID ref_grid,REF_INT node)

{
  uint uVar1;
  int local_40;
  byte local_39;
  int local_38;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT step;
  REF_BOOL complete;
  REF_BOOL interior;
  REF_BOOL allowed;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_private_macro_code_rss = 0;
  interior = node;
  _allowed = ref_grid;
  uVar1 = ref_smooth_local_cell_about(ref_grid->cell[8],ref_grid->node,node,&complete);
  if (uVar1 == 0) {
    if (complete == 0) {
      ref_grid_local._4_4_ = 0;
    }
    else {
      if ((interior < 0) || (_allowed->cell[3]->ref_adj->nnode <= interior)) {
        local_38 = -1;
      }
      else {
        local_38 = _allowed->cell[3]->ref_adj->first[interior];
      }
      local_39 = 0;
      if (local_38 == -1) {
        if ((interior < 0) || (_allowed->cell[6]->ref_adj->nnode <= interior)) {
          local_40 = -1;
        }
        else {
          local_40 = _allowed->cell[6]->ref_adj->first[interior];
        }
        local_39 = local_40 != -1 ^ 0xff;
      }
      step = (REF_INT)(local_39 & 1);
      if (step == 0) {
        ref_grid_local._4_4_ = 0;
      }
      else {
        for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 100;
            ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
          uVar1 = ref_smooth_tet_nso_step(_allowed,interior,&ref_private_macro_code_rss);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x8dd,"ref_smooth_tet_nso",(ulong)uVar1,"step");
            return uVar1;
          }
          if (ref_private_macro_code_rss != 0) break;
        }
        ref_grid_local._4_4_ = 0;
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x8d5,
           "ref_smooth_tet_nso",(ulong)uVar1,"para");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tet_nso(REF_GRID ref_grid, REF_INT node) {
  REF_BOOL allowed, interior;
  REF_BOOL complete = REF_FALSE;
  REF_INT step;

  RSS(ref_smooth_local_cell_about(ref_grid_tet(ref_grid),
                                  ref_grid_node(ref_grid), node, &allowed),
      "para");
  if (!allowed) return REF_SUCCESS;

  interior = ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
             ref_cell_node_empty(ref_grid_qua(ref_grid), node);
  if (!interior) return REF_SUCCESS;

  for (step = 0; step < 100; step++) {
    RSS(ref_smooth_tet_nso_step(ref_grid, node, &complete), "step");
    if (complete) break;
  }

  return REF_SUCCESS;
}